

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Execute(ClientContext *this,shared_ptr<duckdb::Relation,_true> *relation)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t __n;
  pointer pcVar4;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  Relation *pRVar9;
  undefined4 extraout_var;
  shared_ptr<duckdb::Relation,_true> *relation_00;
  pointer pPVar10;
  type lock_00;
  pointer pQVar11;
  reference pvVar12;
  const_reference pvVar13;
  LogicalType *pLVar14;
  reference pvVar15;
  string *psVar16;
  long *plVar17;
  shared_ptr<duckdb::Relation,_true> *in_RDX;
  idx_t i;
  ulong uVar18;
  size_type __n_00;
  pointer *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string err_str;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_1d8;
  string local_1d0;
  undefined1 local_1b0 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  element_type *local_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [32];
  __node_base *local_128 [2];
  __node_base local_118 [2];
  char *local_108 [2];
  char local_f8 [16];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  __buckets_ptr local_c8;
  size_t sStack_c0;
  __node_base local_b8;
  undefined1 local_b0 [128];
  vector<duckdb::ColumnDefinition,_true> *this_00;
  
  LockContext((ClientContext *)local_148);
  pRVar9 = shared_ptr<duckdb::Relation,_true>::operator->(in_RDX);
  iVar8 = (*pRVar9->_vptr_Relation[2])(pRVar9);
  this_00 = (vector<duckdb::ColumnDefinition,_true> *)CONCAT44(extraout_var,iVar8);
  relation_00 = (shared_ptr<duckdb::Relation,_true> *)
                unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                             *)local_148);
  PendingQueryInternal
            ((ClientContext *)local_1b0,(ClientContextLock *)relation,relation_00,SUB81(in_RDX,0));
  pPVar10 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
            ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                          *)local_1b0);
  if ((pPVar10->super_BaseQueryResult).success == false) {
    pPVar10 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                            *)local_1b0);
    local_148[0x18] = (pPVar10->super_BaseQueryResult).error.initialized;
    local_148[0x19] = (pPVar10->super_BaseQueryResult).error.type;
    pcVar4 = (pPVar10->super_BaseQueryResult).error.raw_message._M_dataplus._M_p;
    local_128[0] = local_118;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar4,
               pcVar4 + (pPVar10->super_BaseQueryResult).error.raw_message._M_string_length);
    pcVar4 = (pPVar10->super_BaseQueryResult).error.final_message._M_dataplus._M_p;
    local_108[0] = local_f8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,pcVar4,
               pcVar4 + (pPVar10->super_BaseQueryResult).error.final_message._M_string_length);
    local_e8._M_p = (pointer)0x0;
    local_e0 = (pPVar10->super_BaseQueryResult).error.extra_info._M_h._M_bucket_count;
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ = (pPVar10->super_BaseQueryResult).error.extra_info._M_h._M_element_count;
    local_c8 = *(__buckets_ptr *)
                &(pPVar10->super_BaseQueryResult).error.extra_info._M_h._M_rehash_policy;
    sStack_c0 = (pPVar10->super_BaseQueryResult).error.extra_info._M_h._M_rehash_policy.
                _M_next_resize;
    local_b8._M_nxt = (_Hash_node_base *)0x0;
    local_168._M_allocated_capacity =
         (size_type)
         (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          *)&local_e8;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_e8,&(pPVar10->super_BaseQueryResult).error.extra_info._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)(local_178 + 0x10));
    local_168._8_8_ = 0;
    local_158._M_local_buf[0] = false;
    local_168._M_allocated_capacity = (size_type)&local_158;
    ProcessError((ClientContext *)relation,(ErrorData *)(local_148 + 0x18),
                 (string *)(local_178 + 0x10));
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
              ((duckdb *)&local_1d0,(ErrorData *)(local_148 + 0x18));
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1d0._M_dataplus._M_p;
    local_1d0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_allocated_capacity != &local_158) {
      operator_delete((void *)local_168._M_allocated_capacity);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_e8);
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0]);
    }
    if (local_128[0] != local_118) {
      operator_delete(local_128[0]);
    }
  }
  else {
    local_1d8._M_head_impl = (QueryResult *)0x0;
    unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
    operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
               *)local_148);
    lock_00 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              ::operator*((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_1b0);
    PendingQueryResult::ExecuteInternal
              ((PendingQueryResult *)(local_178 + 0x10),(ClientContextLock *)lock_00);
    uVar6 = local_168._M_allocated_capacity;
    _Var5._M_head_impl = local_1d8._M_head_impl;
    local_168._M_allocated_capacity = 0;
    local_1d8._M_head_impl = (QueryResult *)uVar6;
    if ((_Var5._M_head_impl != (QueryResult *)0x0) &&
       ((*((_Var5._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult[1])(),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_168._M_allocated_capacity !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(*local_168._M_allocated_capacity + 8))();
    }
    pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
              operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)&local_1d8);
    if ((pQVar11->super_BaseQueryResult).success != false) {
      pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                            *)&local_1d8);
      if (((long)(pQVar11->super_BaseQueryResult).types.
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pQVar11->super_BaseQueryResult).types.
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          ((long)(this_00->
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this_00->
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x7b425ed097b425ed != 0) {
LAB_004cb089:
        local_168._M_allocated_capacity = (size_type)&local_158;
        local_148._8_8_ = relation;
        local_148._16_8_ = this;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_178 + 0x10),
                   "Result mismatch in query!\nExpected the following columns: [","");
        if ((this_00->
            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (this_00->
            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __n_00 = 0;
          do {
            if (__n_00 != 0) {
              ::std::__cxx11::string::append(local_178 + 0x10);
            }
            pvVar13 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,__n_00);
            psVar16 = ColumnDefinition::Name_abi_cxx11_(pvVar13);
            pcVar4 = (psVar16->_M_dataplus)._M_p;
            local_1a8._M_pi = &local_198;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a8,pcVar4,pcVar4 + psVar16->_M_string_length);
            ::std::__cxx11::string::append((char *)&local_1a8);
            pvVar13 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,__n_00);
            pLVar14 = ColumnDefinition::Type(pvVar13);
            LogicalType::ToString_abi_cxx11_((string *)local_188,pLVar14);
            p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
            if (local_1a8._M_pi != &local_198) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_198._vptr__Sp_counted_base;
            }
            p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)(_func_int ***)local_188._8_8_ + (long)local_1a0);
            if (p_Var19 < p_Var2) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
              if ((RegisteredStateManager *)local_188._0_8_ != (RegisteredStateManager *)local_178)
              {
                p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._0_8_;
              }
              if (p_Var19 < p_Var2) goto LAB_004cb192;
              plVar17 = (long *)::std::__cxx11::string::replace
                                          ((ulong)local_188,0,(char *)0x0,(ulong)local_1a8._M_pi);
            }
            else {
LAB_004cb192:
              plVar17 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_1a8,local_188._0_8_);
            }
            peVar1 = (element_type *)(plVar17 + 2);
            if ((element_type *)*plVar17 == peVar1) {
              local_1d0.field_2._M_allocated_capacity =
                   *(undefined8 *)
                    &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
              local_1d0.field_2._8_8_ = plVar17[3];
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            }
            else {
              local_1d0.field_2._M_allocated_capacity =
                   *(undefined8 *)
                    &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
              local_1d0._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_1d0._M_string_length = plVar17[1];
            *plVar17 = (long)peVar1;
            plVar17[1] = 0;
            *(undefined1 *)
             &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ = 0;
            ::std::__cxx11::string::_M_append(local_178 + 0x10,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            if ((RegisteredStateManager *)local_188._0_8_ != (RegisteredStateManager *)local_178) {
              operator_delete((void *)local_188._0_8_);
            }
            if (local_1a8._M_pi != &local_198) {
              operator_delete(local_1a8._M_pi);
            }
            __n_00 = __n_00 + 1;
          } while (__n_00 < (ulong)(((long)(this_00->
                                           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                           ).
                                           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this_00->
                                           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                           ).
                                           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x7b425ed097b425ed));
        }
        ::std::__cxx11::string::append(local_178 + 0x10);
        paVar3 = &local_1d0.field_2;
        for (uVar18 = 0;
            pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                                    *)&local_1d8),
            uVar18 < (ulong)(((long)(pQVar11->super_BaseQueryResult).types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pQVar11->super_BaseQueryResult).types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555); uVar18 = uVar18 + 1) {
          ::std::__cxx11::string::append(local_178 + 0x10);
          pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                    ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                                  *)&local_1d8);
          pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&(pQVar11->super_BaseQueryResult).names,uVar18);
          pcVar4 = (pvVar15->_M_dataplus)._M_p;
          local_1a8._M_pi = &local_198;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,pcVar4,pcVar4 + pvVar15->_M_string_length);
          ::std::__cxx11::string::append((char *)&local_1a8);
          pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                    ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                                  *)&local_1d8);
          pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                              (&(pQVar11->super_BaseQueryResult).types,uVar18);
          LogicalType::ToString_abi_cxx11_((string *)local_188,pvVar12);
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if (local_1a8._M_pi != &local_198) {
            p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_198._vptr__Sp_counted_base;
          }
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(local_1a0->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                           __weak_this_.internal.
                           super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + local_188._8_8_);
          if (p_Var19 < p_Var2) {
            p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
            if ((RegisteredStateManager *)local_188._0_8_ != (RegisteredStateManager *)local_178) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._0_8_;
            }
            if (p_Var19 < p_Var2) goto LAB_004cb37b;
            plVar17 = (long *)::std::__cxx11::string::replace
                                        ((ulong)local_188,0,(char *)0x0,(ulong)local_1a8._M_pi);
          }
          else {
LAB_004cb37b:
            plVar17 = (long *)::std::__cxx11::string::_M_append((char *)&local_1a8,local_188._0_8_);
          }
          peVar1 = (element_type *)(plVar17 + 2);
          if ((element_type *)*plVar17 == peVar1) {
            local_1d0.field_2._M_allocated_capacity =
                 *(undefined8 *)
                  &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
            local_1d0.field_2._8_8_ = plVar17[3];
            local_1d0._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1d0.field_2._M_allocated_capacity =
                 *(undefined8 *)
                  &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
            local_1d0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_1d0._M_string_length = plVar17[1];
          *plVar17 = (long)peVar1;
          plVar17[1] = 0;
          *(undefined1 *)
           &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ = 0;
          ::std::__cxx11::string::_M_append(local_178 + 0x10,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar3) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          if ((RegisteredStateManager *)local_188._0_8_ != (RegisteredStateManager *)local_178) {
            operator_delete((void *)local_188._0_8_);
          }
          if (local_1a8._M_pi != &local_198) {
            operator_delete(local_1a8._M_pi);
          }
        }
        ::std::__cxx11::string::append(local_178 + 0x10);
        ErrorData::ErrorData((ErrorData *)local_b0,(string *)(local_178 + 0x10));
        local_1d0._M_string_length = 0;
        local_1d0.field_2._M_allocated_capacity =
             local_1d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1d0._M_dataplus._M_p = (pointer)paVar3;
        ProcessError((ClientContext *)local_148._8_8_,(ErrorData *)local_b0,&local_1d0);
        this = (ClientContext *)local_148._16_8_;
        make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
                  ((duckdb *)&local_1a8,(ErrorData *)local_b0);
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = local_1a8._M_pi;
        local_1a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar3) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_b0 + 0x48));
        if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
          operator_delete((void *)local_b0._40_8_);
        }
        if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
          operator_delete((void *)local_b0._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_allocated_capacity != &local_158) {
          operator_delete((void *)local_168._M_allocated_capacity);
        }
        if ((element_type *)local_1d8._M_head_impl != (element_type *)0x0) {
          (**(code **)(*(long *)&(((weak_ptr<duckdb::ClientContext,_true> *)
                                  &((local_1d8._M_head_impl)->super_BaseQueryResult).
                                   _vptr_BaseQueryResult)->internal).
                                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                      + 8))();
        }
        goto LAB_004cb50b;
      }
      for (uVar18 = 0;
          pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                    ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                                  *)&local_1d8),
          uVar18 < (ulong)(((long)(pQVar11->super_BaseQueryResult).types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pQVar11->super_BaseQueryResult).types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555); uVar18 = uVar18 + 1) {
        pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                              *)&local_1d8);
        pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                            (&(pQVar11->super_BaseQueryResult).types,uVar18);
        pvVar13 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,uVar18);
        pLVar14 = ColumnDefinition::Type(pvVar13);
        bVar7 = LogicalType::operator==(pvVar12,pLVar14);
        if (!bVar7) goto LAB_004cb089;
        pQVar11 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                              *)&local_1d8);
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&(pQVar11->super_BaseQueryResult).names,uVar18);
        pvVar13 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,uVar18);
        psVar16 = ColumnDefinition::Name_abi_cxx11_(pvVar13);
        __n = pvVar15->_M_string_length;
        if ((__n != psVar16->_M_string_length) ||
           ((__n != 0 &&
            (iVar8 = bcmp((pvVar15->_M_dataplus)._M_p,(psVar16->_M_dataplus)._M_p,__n), iVar8 != 0))
           )) goto LAB_004cb089;
      }
    }
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1d8._M_head_impl;
  }
LAB_004cb50b:
  if (local_1b0 != (undefined1  [8])0x0) {
    (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                 &((BaseQueryResult *)local_1b0)->_vptr_BaseQueryResult)->internal).
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
               *)local_148);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (__uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Execute(const shared_ptr<Relation> &relation) {
	auto lock = LockContext();
	auto &expected_columns = relation->Columns();
	auto pending = PendingQueryInternal(*lock, relation, false);
	if (!pending->success) {
		return ErrorResult<MaterializedQueryResult>(pending->GetErrorObject());
	}

	unique_ptr<QueryResult> result;
	result = ExecutePendingQueryInternal(*lock, *pending);
	if (result->HasError()) {
		return result;
	}
	// verify that the result types and result names of the query match the expected result types/names
	if (result->types.size() == expected_columns.size()) {
		bool mismatch = false;
		for (idx_t i = 0; i < result->types.size(); i++) {
			if (result->types[i] != expected_columns[i].Type() || result->names[i] != expected_columns[i].Name()) {
				mismatch = true;
				break;
			}
		}
		if (!mismatch) {
			// all is as expected: return the result
			return result;
		}
	}
	// result mismatch
	string err_str = "Result mismatch in query!\nExpected the following columns: [";
	for (idx_t i = 0; i < expected_columns.size(); i++) {
		if (i > 0) {
			err_str += ", ";
		}
		err_str += expected_columns[i].Name() + " " + expected_columns[i].Type().ToString();
	}
	err_str += "]\nBut result contained the following: ";
	for (idx_t i = 0; i < result->types.size(); i++) {
		err_str += i == 0 ? "[" : ", ";
		err_str += result->names[i] + " " + result->types[i].ToString();
	}
	err_str += "]";
	return ErrorResult<MaterializedQueryResult>(ErrorData(err_str));
}